

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::binary_evaluator(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   *this,XprType *xpr)

{
  scalar_product_op<double,_double> *psVar1;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  *xpr_00;
  _RhsNested *this_00;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  *in_RSI;
  scalar_product_op<double,_double> *in_RDI;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffffb8;
  evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffffc0;
  
  evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>
  ::evaluator_base((evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                    *)0x16080d);
  psVar1 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
           ::functor(in_RSI);
  scalar_product_op<double,_double>::scalar_product_op(in_RDI,psVar1);
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
  ::lhs(in_RSI);
  evaluator<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::evaluator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  xpr_00 = (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
            *)(in_RDI + 0x20);
  this_00 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
            ::rhs(in_RSI);
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
  ::evaluator((evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               *)this_00,xpr_00);
  return;
}

Assistant:

binary_evaluator(const XprType& xpr)
    : m_functor(xpr.functor()),
      m_lhsImpl(xpr.lhs()), 
      m_rhsImpl(xpr.rhs())  
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(functor_traits<BinaryOp>::Cost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }